

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

ON_ClassId * ON_ClassId::ClassId(ON_UUID uuid)

{
  int iVar1;
  ON_ClassId **ppOVar2;
  ON_UUID sumsrf;
  ON_UUID revsrf;
  ON_UUID br2;
  ON_UUID br1;
  ON_UUID br0;
  ON_UUID pc0;
  ON_UUID ns1;
  ON_UUID ns0;
  ON_UUID nc1;
  ON_UUID nc0;
  ON_UUID local_c8;
  ON_UUID local_b8;
  ON_UUID local_a8;
  ON_UUID local_98;
  ON_UUID local_88;
  ON_UUID local_78;
  ON_UUID local_68;
  ON_UUID local_58;
  ON_UUID local_48;
  ON_UUID local_38;
  ON_UUID local_28;
  
  ppOVar2 = &m_p0;
  while (ppOVar2 = &((ON_ClassId *)ppOVar2)->m_pNext->m_pNext,
        (ON_ClassId *)ppOVar2 != (ON_ClassId *)0x0) {
    iVar1 = ON_UuidCompare(&((ON_ClassId *)ppOVar2)->m_uuid,&local_c8);
    if (iVar1 == 0) {
      return (ON_ClassId *)ppOVar2;
    }
  }
  if (g_bDisableDemotion == '\0') {
    local_28.Data1 = 0x5eaf1119;
    local_28.Data2 = 0xb51;
    local_28.Data3 = 0x11d4;
    local_28.Data4[0] = 0xbf;
    local_28.Data4[1] = 0xfe;
    local_28.Data4[2] = '\0';
    local_28.Data4[3] = '\x10';
    local_28.Data4[4] = 0x83;
    local_28.Data4[5] = '\x01';
    local_28.Data4[6] = '\"';
    local_28.Data4[7] = 0xf0;
    local_38.Data1 = 0x76a709d5;
    local_38.Data2 = 0x1550;
    local_38.Data3 = 0x11d4;
    local_38.Data4[0] = 0x80;
    local_38.Data4[1] = '\0';
    local_38.Data4[2] = '\0';
    local_38.Data4[3] = '\x10';
    local_38.Data4[4] = 0x83;
    local_38.Data4[5] = '\x01';
    local_38.Data4[6] = '\"';
    local_38.Data4[7] = 0xf0;
    local_48.Data1 = 0x4760c817;
    local_48.Data2 = 0xbe3;
    local_48.Data3 = 0x11d4;
    local_48.Data4[0] = 0xbf;
    local_48.Data4[1] = 0xfe;
    local_48.Data4[2] = '\0';
    local_48.Data4[3] = '\x10';
    local_48.Data4[4] = 0x83;
    local_48.Data4[5] = '\x01';
    local_48.Data4[6] = '\"';
    local_48.Data4[7] = 0xf0;
    local_58.Data1 = 0xfa4fd4b5;
    local_58.Data2 = 0x1613;
    local_58.Data3 = 0x11d4;
    local_58.Data4[0] = 0x80;
    local_58.Data4[1] = '\0';
    local_58.Data4[2] = '\0';
    local_58.Data4[3] = '\x10';
    local_58.Data4[4] = 0x83;
    local_58.Data4[5] = '\x01';
    local_58.Data4[6] = '\"';
    local_58.Data4[7] = 0xf0;
    local_68.Data1 = 0xef638317;
    local_68.Data2 = 0x154b;
    local_68.Data3 = 0x11d4;
    local_68.Data4[0] = 0x80;
    local_68.Data4[1] = '\0';
    local_68.Data4[2] = '\0';
    local_68.Data4[3] = '\x10';
    local_68.Data4[4] = 0x83;
    local_68.Data4[5] = '\x01';
    local_68.Data4[6] = '\"';
    local_68.Data4[7] = 0xf0;
    local_78.Data1 = 0x705fdef;
    local_78.Data2 = 0x3e2a;
    local_78.Data3 = 0x11d4;
    local_78.Data4[0] = 0x80;
    local_78.Data4[1] = '\x0e';
    local_78.Data4[2] = '\0';
    local_78.Data4[3] = '\x10';
    local_78.Data4[4] = 0x83;
    local_78.Data4[5] = '\x01';
    local_78.Data4[6] = '\"';
    local_78.Data4[7] = 0xf0;
    local_88.Data1 = 0x2d4cfedb;
    local_88.Data2 = 0x3e2a;
    local_88.Data3 = 0x11d4;
    local_88.Data4[0] = 0x80;
    local_88.Data4[1] = '\x0e';
    local_88.Data4[2] = '\0';
    local_88.Data4[3] = '\x10';
    local_88.Data4[4] = 0x83;
    local_88.Data4[5] = '\x01';
    local_88.Data4[6] = '\"';
    local_88.Data4[7] = 0xf0;
    local_98.Data1 = 0xf06fc243;
    local_98.Data2 = 0xa32a;
    local_98.Data3 = 0x4608;
    local_98.Data4[0] = 0x9d;
    local_98.Data4[1] = 0xd8;
    local_98.Data4[2] = 0xa7;
    local_98.Data4[3] = 0xd2;
    local_98.Data4[4] = 0xc4;
    local_98.Data4[5] = 0xce;
    local_98.Data4[6] = '*';
    local_98.Data4[7] = '6';
    local_a8.Data1 = 0xa8401b6;
    local_a8.Data2 = 0x4d34;
    local_a8.Data3 = 0x4b99;
    local_a8.Data4[0] = 0x86;
    local_a8.Data4[1] = '\x15';
    local_a8.Data4[2] = '\x1b';
    local_a8.Data4[3] = 'N';
    local_a8.Data4[4] = 'r';
    local_a8.Data4[5] = '=';
    local_a8.Data4[6] = 0xc4;
    local_a8.Data4[7] = 0xe5;
    local_b8.Data1 = 0x665f6331;
    local_b8.Data2 = 0x2a66;
    local_b8.Data3 = 0x4cce;
    local_b8.Data4[0] = 0x81;
    local_b8.Data4[1] = 0xd0;
    local_b8.Data4[2] = 0xb5;
    local_b8.Data4[3] = 0xee;
    local_b8.Data4[4] = 0xbd;
    local_b8.Data4[5] = 0x9b;
    local_b8.Data4[6] = 'T';
    local_b8.Data4[7] = '\x17';
    iVar1 = ON_UuidCompare(&local_c8,&local_28);
    if (iVar1 == 0) {
      return &ON_NurbsCurve::m_ON_NurbsCurve_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_38);
    if (iVar1 == 0) {
      return &ON_NurbsCurve::m_ON_NurbsCurve_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_48);
    if (iVar1 == 0) {
      return &ON_NurbsSurface::m_ON_NurbsSurface_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_58);
    if (iVar1 == 0) {
      return &ON_NurbsSurface::m_ON_NurbsSurface_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_68);
    if (iVar1 == 0) {
      return &ON_PolyCurve::m_ON_PolyCurve_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_78);
    if (iVar1 == 0) {
      return &ON_Brep::m_ON_Brep_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_88);
    if (iVar1 == 0) {
      return &ON_Brep::m_ON_Brep_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_98);
    if (iVar1 == 0) {
      return &ON_Brep::m_ON_Brep_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_a8);
    if (iVar1 == 0) {
      return &ON_RevSurface::m_ON_RevSurface_class_rtti;
    }
    iVar1 = ON_UuidCompare(&local_c8,&local_b8);
    if (iVar1 == 0) {
      return &ON_SumSurface::m_ON_SumSurface_class_rtti;
    }
  }
  return (ON_ClassId *)0x0;
}

Assistant:

const ON_ClassId* ON_ClassId::ClassId( ON_UUID uuid )
{
  // static member function
  // search list of class ids for one with a matching typecode
  const ON_ClassId* p;
  for(p = m_p0; p; p = p->m_pNext) 
  {
    if ( !ON_UuidCompare(&p->m_uuid,&uuid) )
      break;
  }

  if ( nullptr == p && false == g_bDisableDemotion) 
  {
    // enable OpenNURBS toolkit to read files that contain old uuids even when
    // old class definitions are not loaded.

    // 5EAF1119-0B51-11d4-BFFE-0010830122F0 = TL_NurbsCurve
    ON_UUID nc0 = {0x5EAF1119,0x0B51,0x11d4,{0xBF,0xFE,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 76A709D5-1550-11d4-8000-0010830122F0 = old nurbs curve
    ON_UUID nc1 = {0x76A709D5,0x1550,0x11d4,{0x80,0x00,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 4760C817-0BE3-11d4-BFFE-0010830122F0 = TL_NurbsSurface
    ON_UUID ns0 = {0x4760C817,0x0BE3,0x11d4,{0xBF,0xFE,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // FA4FD4B5-1613-11d4-8000-0010830122F0 = old nurbs surface
    ON_UUID ns1 = {0xFA4FD4B5,0x1613,0x11d4,{0x80,0x00,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // EF638317-154B-11d4-8000-0010830122F0 = old poly curve
    ON_UUID pc0 = {0xEF638317,0x154B,0x11d4,{0x80,0x00,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 0705FDEF-3E2A-11d4-800E-0010830122F0 = old trimmed surface
    ON_UUID br0 = {0x0705FDEF,0x3E2A,0x11d4,{0x80,0x0E,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 2D4CFEDB-3E2A-11d4-800E-0010830122F0 = old b-rep
    ON_UUID br1 = {0x2D4CFEDB,0x3E2A,0x11d4,{0x80,0x0E,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // F06FC243-A32A-4608-9DD8-A7D2C4CE2A36 = TL_Brep
    ON_UUID br2 = {0xF06FC243,0xA32A,0x4608,{0x9D,0xD8, 0xA7,0xD2,0xC4,0xCE,0x2A,0x36}};

    // 0A8401B6-4D34-4b99-8615-1B4E723DC4E5 = TL_RevSurface
    ON_UUID revsrf = { 0xa8401b6, 0x4d34, 0x4b99, { 0x86, 0x15, 0x1b, 0x4e, 0x72, 0x3d, 0xc4, 0xe5 } };

    // 665F6331-2A66-4cce-81D0-B5EEBD9B5417 = TL_SumSurface
    ON_UUID sumsrf = { 0x665f6331, 0x2a66, 0x4cce, { 0x81, 0xd0, 0xb5, 0xee, 0xbd, 0x9b, 0x54, 0x17 } };

    if      ( !ON_UuidCompare( &uuid, &nc0 ) || !ON_UuidCompare( &uuid, &nc1 ) )
      p = &ON_CLASS_RTTI(ON_NurbsCurve);
    else if ( !ON_UuidCompare( &uuid, &ns0 ) || !ON_UuidCompare( &uuid, &ns1 ) )
      p = &ON_CLASS_RTTI(ON_NurbsSurface);
    else if ( !ON_UuidCompare( &uuid, &pc0 ) )
      p = &ON_CLASS_RTTI(ON_PolyCurve);
    else if ( !ON_UuidCompare( &uuid, &br0 ) || !ON_UuidCompare( &uuid, &br1 ) || !ON_UuidCompare( &uuid, &br2 ) )
      p = &ON_CLASS_RTTI(ON_Brep);
    else if ( !ON_UuidCompare( &uuid, &revsrf ) )
      p = &ON_CLASS_RTTI(ON_RevSurface);
    else if ( !ON_UuidCompare( &uuid, &sumsrf ) )
      p = &ON_CLASS_RTTI(ON_SumSurface);
    else
    {
      // The p = nullptr line does nothing (p is already nullptr) but, if you're working on
      // file reading bugs or other cases that involving rtti bugs, then it's a good 
      // location for a debugger breakpoint.
      p = nullptr;
    }
  }
  return p;
}